

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::FileDescriptorSet::ByteSizeLong(FileDescriptorSet *this)

{
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *this_00;
  size_t sVar1;
  void **ppvVar2;
  const_iterator cVar3;
  size_t sVar4;
  
  sVar1 = internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  sVar1 = (long)*(int *)((long)&this->field_0 + 0x20) + sVar1;
  this_00 = &(this->field_0)._impl_.file_;
  ppvVar2 = internal::RepeatedPtrFieldBase::elements(&this_00->super_RepeatedPtrFieldBase);
  cVar3 = RepeatedPtrField<google::protobuf::FileDescriptorProto>::end(this_00);
  for (; ppvVar2 != cVar3.it_; ppvVar2 = ppvVar2 + 1) {
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::FileDescriptorProto>
                      ((FileDescriptorProto *)*ppvVar2);
    sVar1 = sVar1 + sVar4;
  }
  sVar1 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar1,&(this->field_0)._impl_._cached_size_);
  return sVar1;
}

Assistant:

::size_t FileDescriptorSet::ByteSizeLong() const {
  const FileDescriptorSet& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.FileDescriptorSet)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.FileDescriptorProto file = 1;
    {
      total_size += 1UL * this_._internal_file_size();
      for (const auto& msg : this_._internal_file()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}